

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/SVM.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  LinearKernel::LinearKernel((LinearKernel *)&_LinearKernel_default_instance_);
  DAT_003cb1a0 = 1;
  RBFKernel::RBFKernel((RBFKernel *)&_RBFKernel_default_instance_);
  DAT_003cb1c8 = 1;
  PolyKernel::PolyKernel((PolyKernel *)&_PolyKernel_default_instance_);
  DAT_003cb1f8 = 1;
  SigmoidKernel::SigmoidKernel((SigmoidKernel *)&_SigmoidKernel_default_instance_);
  DAT_003cb228 = 1;
  Kernel::Kernel((Kernel *)&_Kernel_default_instance_);
  DAT_003cb250 = 1;
  SparseNode::SparseNode((SparseNode *)&_SparseNode_default_instance_);
  DAT_003cb298 = 1;
  SparseVector::SparseVector((SparseVector *)&_SparseVector_default_instance_);
  DAT_003cb2d0 = 1;
  SparseSupportVectors::SparseSupportVectors
            ((SparseSupportVectors *)&_SparseSupportVectors_default_instance_);
  DAT_003cb308 = 1;
  DenseVector::DenseVector((DenseVector *)&_DenseVector_default_instance_);
  DAT_003cb338 = 1;
  DenseSupportVectors::DenseSupportVectors
            ((DenseSupportVectors *)&_DenseSupportVectors_default_instance_);
  DAT_003cb370 = 1;
  Coefficients::Coefficients((Coefficients *)&_Coefficients_default_instance_);
  DAT_003cb3a0 = 1;
  SupportVectorRegressor::SupportVectorRegressor
            ((SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_);
  DAT_003cb3e0 = 1;
  SupportVectorClassifier::SupportVectorClassifier
            ((SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_);
  DAT_003cb4a8 = 1;
  DAT_003cb3b8 = &_Kernel_default_instance_;
  DAT_003cb3c0 = &_Coefficients_default_instance_;
  DAT_003cb480 = &_Kernel_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _LinearKernel_default_instance_.DefaultConstruct();
  _RBFKernel_default_instance_.DefaultConstruct();
  _PolyKernel_default_instance_.DefaultConstruct();
  _SigmoidKernel_default_instance_.DefaultConstruct();
  _Kernel_default_instance_.DefaultConstruct();
  _SparseNode_default_instance_.DefaultConstruct();
  _SparseVector_default_instance_.DefaultConstruct();
  _SparseSupportVectors_default_instance_.DefaultConstruct();
  _DenseVector_default_instance_.DefaultConstruct();
  _DenseSupportVectors_default_instance_.DefaultConstruct();
  _Coefficients_default_instance_.DefaultConstruct();
  _SupportVectorRegressor_default_instance_.DefaultConstruct();
  _SupportVectorClassifier_default_instance_.DefaultConstruct();
  _SupportVectorRegressor_default_instance_.get_mutable()->kernel_ = const_cast< ::CoreML::Specification::Kernel*>(
      ::CoreML::Specification::Kernel::internal_default_instance());
  _SupportVectorRegressor_default_instance_.get_mutable()->coefficients_ = const_cast< ::CoreML::Specification::Coefficients*>(
      ::CoreML::Specification::Coefficients::internal_default_instance());
  _SupportVectorClassifier_default_instance_.get_mutable()->kernel_ = const_cast< ::CoreML::Specification::Kernel*>(
      ::CoreML::Specification::Kernel::internal_default_instance());
}